

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2926b4::sessionFixture::createSession
          (sessionFixture *this,int heartBtInt,int startDay,int endDay)

{
  string *beginString;
  string *senderCompID;
  string *targetCompID;
  BeginString *beginString_00;
  Session *pSVar1;
  anon_class_8_1_8991fb9c local_818;
  function<FIX::UtcTimeStamp_()> local_810;
  allocator<char> local_7e9;
  string local_7e8;
  string local_7c8;
  undefined1 local_7a8 [8];
  DataDictionaryProvider provider;
  TimeRange sessionTime;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  STRING local_2f8;
  StringField local_2d8;
  allocator<char> local_279;
  STRING local_278;
  StringField local_258;
  allocator<char> local_1e9;
  STRING local_1e8;
  StringField local_1c8;
  undefined1 local_170 [8];
  SessionID sessionID;
  int endDay_local;
  int startDay_local;
  int heartBtInt_local;
  sessionFixture *this_local;
  
  sessionID.m_frozenString.field_2._12_4_ = endDay;
  if ((this->object != (Session *)0x0) && (this->object != (Session *)0x0)) {
    (**(code **)(*(long *)this->object + 8))();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"FIX.4.2",&local_1e9);
  FIX::BeginString::BeginString((BeginString *)&local_1c8,&local_1e8);
  beginString = FIX::StringField::operator_cast_to_string_(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"TW",&local_279);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_258,&local_278);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"ISLD",&local_2f9);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_2d8,&local_2f8);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"",&local_321);
  FIX::SessionID::SessionID((SessionID *)local_170,beginString,senderCompID,targetCompID,&local_320)
  ;
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  FIX::BeginString::~BeginString((BeginString *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  FIX::TimeRange::TimeRange
            ((TimeRange *)&provider.field_0x438,&(this->super_TestCallback).startTime,
             &(this->super_TestCallback).endTime,startDay,sessionID.m_frozenString.field_2._12_4_);
  FIX::DataDictionaryProvider::DataDictionaryProvider((DataDictionaryProvider *)local_7a8);
  beginString_00 = FIX::SessionID::getBeginString((SessionID *)local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"FIX42",&local_7e9);
  FIX::TestSettings::pathForSpec(&local_7c8,&local_7e8);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            ((DataDictionaryProvider *)local_7a8,beginString_00,&local_7c8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  pSVar1 = (Session *)operator_new(0x878);
  local_818.this = this;
  std::function<FIX::UtcTimeStamp()>::
  function<(anonymous_namespace)::sessionFixture::createSession(int,int,int)::_lambda()_1_,void>
            ((function<FIX::UtcTimeStamp()> *)&local_810,&local_818);
  FIX::Session::Session
            (pSVar1,&local_810,&(this->super_TestCallback).super_NullApplication,&this->factory,
             local_170,local_7a8,&provider.field_0x438,heartBtInt,0);
  this->object = pSVar1;
  std::function<FIX::UtcTimeStamp_()>::~function(&local_810);
  FIX::Session::setResponder(this->object,(Responder *)this);
  FIX::DataDictionaryProvider::~DataDictionaryProvider((DataDictionaryProvider *)local_7a8);
  FIX::TimeRange::~TimeRange((TimeRange *)&provider.field_0x438);
  FIX::SessionID::~SessionID((SessionID *)local_170);
  return;
}

Assistant:

virtual void createSession(int heartBtInt, int startDay = -1, int endDay = -1) {
    if (object) {
      delete object;
    }

    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("TW"), TargetCompID("ISLD"));
    TimeRange sessionTime(startTime, endTime, startDay, endDay);

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary(sessionID.getBeginString(), FIX::TestSettings::pathForSpec("FIX42"));
    object = new Session([this]() { return now; }, *this, factory, sessionID, provider, sessionTime, heartBtInt, 0);
    object->setResponder(this);
  }